

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O2

void __thiscall
flatbuffers::go::GoGenerator::GenNativeTablePack
          (GoGenerator *this,StructDef *struct_def,string *code_ptr)

{
  IdlNamer *pIVar1;
  BaseType BVar2;
  FieldDef *pFVar3;
  EnumDef *pEVar4;
  GoGenerator *pGVar5;
  pointer ppFVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  string length;
  string offsets;
  string field_field;
  string field_var;
  string offset;
  string struct_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  IdlNamer *local_190;
  StructDef *local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  GoGenerator *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  pointer local_b8;
  Type local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  pIVar1 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_d8,pIVar1,struct_def);
  local_188 = struct_def;
  (*(this->namer_).super_Namer._vptr_Namer[0x11])(&local_160,pIVar1,struct_def);
  std::operator+(&local_180,"func (t *",&local_160);
  std::operator+(&local_1d0,&local_180,
                 ") Pack(builder *flatbuffers.Builder) flatbuffers.UOffsetT {\n");
  std::__cxx11::string::append((string *)code_ptr);
  local_140 = this;
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::append((char *)code_ptr);
  ppFVar6 = (local_188->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_190 = pIVar1;
  do {
    pIVar1 = local_190;
    if (ppFVar6 ==
        (local_188->fields).vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::operator+(&local_180,"\t",&local_d8);
      std::operator+(&local_1d0,&local_180,"Start(builder)\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_180);
      for (ppFVar6 = (local_188->fields).vec.
                     super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; pIVar1 = local_190,
          ppFVar6 !=
          (local_188->fields).vec.
          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppFVar6 = ppFVar6 + 1) {
        pFVar3 = *ppFVar6;
        if (pFVar3->deprecated == false) {
          (*(local_190->super_Namer)._vptr_Namer[0x12])(&local_1d0,local_190,pFVar3);
          (*(pIVar1->super_Namer)._vptr_Namer[6])(&local_180,pIVar1,pFVar3);
          (*(pIVar1->super_Namer)._vptr_Namer[7])(&local_230,pIVar1,pFVar3);
          std::operator+(&local_160,&local_230,"Offset");
          std::__cxx11::string::~string((string *)&local_230);
          BVar2 = (pFVar3->value).type.base_type;
          if (BVar2 - BASE_TYPE_UTYPE < 0xc) {
            local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
            local_230._M_string_length = 0;
            local_230.field_2._M_local_buf[0] = '\0';
            if (pFVar3->presence == kOptional) {
              std::operator+(&local_250,"\tif t.",&local_1d0);
              std::operator+(&local_210,&local_250," != nil {\n\t");
              std::__cxx11::string::append((string *)code_ptr);
              std::__cxx11::string::~string((string *)&local_210);
              std::__cxx11::string::~string((string *)&local_250);
              std::__cxx11::string::assign((char *)&local_230);
            }
            pEVar4 = (pFVar3->value).type.enum_def;
            if ((pEVar4 == (EnumDef *)0x0) || (pEVar4->is_union == false)) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_f8,"\t",&local_d8);
              std::operator+(&local_118,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_f8,"Add");
              std::operator+(&local_138,&local_118,&local_180);
              std::operator+(&local_1b0,&local_138,"(builder, ");
              std::operator+(&local_1f0,&local_1b0,&local_230);
              std::operator+(&local_270,&local_1f0,"t.");
              std::operator+(&local_250,&local_270,&local_1d0);
              std::operator+(&local_210,&local_250,")\n");
              std::__cxx11::string::append((string *)code_ptr);
              std::__cxx11::string::~string((string *)&local_210);
              std::__cxx11::string::~string((string *)&local_250);
              std::__cxx11::string::~string((string *)&local_270);
              std::__cxx11::string::~string((string *)&local_1f0);
              std::__cxx11::string::~string((string *)&local_1b0);
              std::__cxx11::string::~string((string *)&local_138);
              std::__cxx11::string::~string((string *)&local_118);
              std::__cxx11::string::~string((string *)local_f8);
            }
            if (((pFVar3->value).type.base_type - BASE_TYPE_UTYPE < 0xc) &&
               (pFVar3->presence == kOptional)) {
              std::__cxx11::string::append((char *)code_ptr);
            }
            pbVar7 = &local_230;
          }
          else {
            if ((BVar2 == BASE_TYPE_STRUCT) && (((pFVar3->value).type.struct_def)->fixed == true)) {
              std::operator+(&local_270,"\t",&local_160);
              std::operator+(&local_250,&local_270," := t.");
              std::operator+(&local_210,&local_250,&local_1d0);
              std::operator+(&local_230,&local_210,".Pack(builder)\n");
              std::__cxx11::string::append((string *)code_ptr);
              std::__cxx11::string::~string((string *)&local_230);
              std::__cxx11::string::~string((string *)&local_210);
              std::__cxx11::string::~string((string *)&local_250);
              std::__cxx11::string::~string((string *)&local_270);
            }
            else {
              pEVar4 = (pFVar3->value).type.enum_def;
              if ((pEVar4 != (EnumDef *)0x0) && (pEVar4->is_union == true)) {
                std::operator+(&local_210,"\tif t.",&local_1d0);
                std::operator+(&local_230,&local_210," != nil {\n");
                std::__cxx11::string::append((string *)code_ptr);
                std::__cxx11::string::~string((string *)&local_230);
                std::__cxx11::string::~string((string *)&local_210);
                std::operator+(&local_1b0,"\t\t",&local_d8);
                std::operator+(&local_1f0,&local_1b0,"Add");
                std::operator+(&local_118,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pFVar3,"_type");
                (*(local_140->namer_).super_Namer._vptr_Namer[0x14])
                          (&local_138,local_190,&local_118,
                           (ulong)(local_140->namer_).super_Namer.config_.methods);
                std::operator+(&local_270,&local_1f0,&local_138);
                std::operator+(&local_250,&local_270,"(builder, t.");
                std::operator+(&local_210,&local_250,&local_1d0);
                std::operator+(&local_230,&local_210,".Type)\n");
                std::__cxx11::string::append((string *)code_ptr);
                std::__cxx11::string::~string((string *)&local_230);
                std::__cxx11::string::~string((string *)&local_210);
                std::__cxx11::string::~string((string *)&local_250);
                std::__cxx11::string::~string((string *)&local_270);
                std::__cxx11::string::~string((string *)&local_138);
                std::__cxx11::string::~string((string *)&local_118);
                std::__cxx11::string::~string((string *)&local_1f0);
                std::__cxx11::string::~string((string *)&local_1b0);
                std::__cxx11::string::append((char *)code_ptr);
              }
            }
            std::operator+(&local_1b0,"\t",&local_d8);
            std::operator+(&local_1f0,&local_1b0,"Add");
            std::operator+(&local_270,&local_1f0,&local_180);
            std::operator+(&local_250,&local_270,"(builder, ");
            std::operator+(&local_210,&local_250,&local_160);
            std::operator+(&local_230,&local_210,")\n");
            std::__cxx11::string::append((string *)code_ptr);
            std::__cxx11::string::~string((string *)&local_230);
            std::__cxx11::string::~string((string *)&local_210);
            std::__cxx11::string::~string((string *)&local_250);
            std::__cxx11::string::~string((string *)&local_270);
            std::__cxx11::string::~string((string *)&local_1f0);
            pbVar7 = &local_1b0;
          }
          std::__cxx11::string::~string((string *)pbVar7);
          std::__cxx11::string::~string((string *)&local_160);
          std::__cxx11::string::~string((string *)&local_180);
          std::__cxx11::string::~string((string *)&local_1d0);
        }
      }
      std::operator+(&local_180,"\treturn ",&local_d8);
      std::operator+(&local_1d0,&local_180,"End(builder)\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::append((char *)code_ptr);
      std::__cxx11::string::~string((string *)&local_d8);
      return;
    }
    pFVar3 = *ppFVar6;
    if ((pFVar3->deprecated != false) || ((pFVar3->value).type.base_type - BASE_TYPE_UTYPE < 0xc))
    goto LAB_001a99ab;
    local_b8 = ppFVar6;
    (*(local_190->super_Namer)._vptr_Namer[0x12])(&local_1d0,local_190,pFVar3);
    (*(pIVar1->super_Namer)._vptr_Namer[7])(&local_180,pIVar1,pFVar3);
    std::operator+(&local_160,&local_180,"Offset");
    switch((pFVar3->value).type.base_type) {
    case BASE_TYPE_STRING:
      std::operator+(&local_210,"\t",&local_160);
      std::operator+(&local_230,&local_210," := flatbuffers.UOffsetT(0)\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_210);
      std::operator+(&local_210,"\tif t.",&local_1d0);
      std::operator+(&local_230,&local_210," != \"\" {\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_210);
      std::operator+(&local_270,"\t\t",&local_160);
      std::operator+(&local_250,&local_270," = builder.CreateString(t.");
      std::operator+(&local_210,&local_250,&local_1d0);
      std::operator+(&local_230,&local_210,")\n");
      std::__cxx11::string::append((string *)code_ptr);
      goto LAB_001a994d;
    case BASE_TYPE_VECTOR:
    case BASE_TYPE_VECTOR64:
      if (((pFVar3->value).type.element != BASE_TYPE_UCHAR) ||
         ((pFVar3->value).type.enum_def != (EnumDef *)0x0)) {
        std::operator+(&local_210,"\t",&local_160);
        std::operator+(&local_230,&local_210," := flatbuffers.UOffsetT(0)\n");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&local_210);
        std::operator+(&local_210,"\tif t.",&local_1d0);
        std::operator+(&local_230,&local_210," != nil {\n");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&local_210);
        std::operator+(&local_230,&local_180,"Length");
        std::operator+(&local_210,&local_180,"Offsets");
        std::operator+(&local_1b0,"\t\t",&local_230);
        std::operator+(&local_1f0,&local_1b0," := len(t.");
        std::operator+(&local_270,&local_1f0,&local_1d0);
        std::operator+(&local_250,&local_270,")\n");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&local_270);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_1b0);
        BVar2 = (pFVar3->value).type.element;
        if (BVar2 == BASE_TYPE_STRUCT) {
          if (((pFVar3->value).type.struct_def)->fixed == false) {
            std::operator+(&local_1b0,"\t\t",&local_210);
            std::operator+(&local_1f0,&local_1b0," := make([]flatbuffers.UOffsetT, ");
            std::operator+(&local_270,&local_1f0,&local_230);
            std::operator+(&local_250,&local_270,")\n");
            std::__cxx11::string::append((string *)code_ptr);
            std::__cxx11::string::~string((string *)&local_250);
            std::__cxx11::string::~string((string *)&local_270);
            std::__cxx11::string::~string((string *)&local_1f0);
            std::__cxx11::string::~string((string *)&local_1b0);
            std::operator+(&local_270,"\t\tfor j := 0; j < ",&local_230);
            std::operator+(&local_250,&local_270,"; j++ {\n");
            std::__cxx11::string::append((string *)code_ptr);
            std::__cxx11::string::~string((string *)&local_250);
            std::__cxx11::string::~string((string *)&local_270);
            std::operator+(&local_1b0,"\t\t\t",&local_210);
            std::operator+(&local_1f0,&local_1b0,"[j] = t.");
            std::operator+(&local_270,&local_1f0,&local_1d0);
            std::operator+(&local_250,&local_270,"[j].Pack(builder)\n");
            std::__cxx11::string::append((string *)code_ptr);
            goto LAB_001a9348;
          }
        }
        else if (BVar2 == BASE_TYPE_STRING) {
          std::operator+(&local_1b0,"\t\t",&local_210);
          std::operator+(&local_1f0,&local_1b0," := make([]flatbuffers.UOffsetT, ");
          std::operator+(&local_270,&local_1f0,&local_230);
          std::operator+(&local_250,&local_270,")\n");
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&local_250);
          std::__cxx11::string::~string((string *)&local_270);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::operator+(&local_270,"\t\tfor j := 0; j < ",&local_230);
          std::operator+(&local_250,&local_270,"; j++ {\n");
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&local_250);
          std::__cxx11::string::~string((string *)&local_270);
          std::operator+(&local_1b0,"\t\t\t",&local_210);
          std::operator+(&local_1f0,&local_1b0,"[j] = builder.CreateString(t.");
          std::operator+(&local_270,&local_1f0,&local_1d0);
          std::operator+(&local_250,&local_270,"[j])\n");
          std::__cxx11::string::append((string *)code_ptr);
LAB_001a9348:
          std::__cxx11::string::~string((string *)&local_250);
          std::__cxx11::string::~string((string *)&local_270);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::__cxx11::string::append((char *)code_ptr);
        }
        std::operator+(&local_118,"\t\t",&local_d8);
        std::operator+(&local_138,&local_118,"Start");
        (*(local_190->super_Namer)._vptr_Namer[6])
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   local_190,pFVar3);
        std::operator+(&local_1b0,&local_138,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                      );
        std::operator+(&local_1f0,&local_1b0,"Vector(builder, ");
        std::operator+(&local_270,&local_1f0,&local_230);
        std::operator+(&local_250,&local_270,")\n");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&local_270);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)local_f8);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)&local_118);
        std::operator+(&local_270,"\t\tfor j := ",&local_230);
        std::operator+(&local_250,&local_270," - 1; j >= 0; j-- {\n");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&local_270);
        pGVar5 = local_140;
        BVar2 = (pFVar3->value).type.element;
        if (BVar2 - BASE_TYPE_UTYPE < 0xc) {
          local_f8._24_2_ = (pFVar3->value).type.fixed_length;
          local_f8._4_4_ = BASE_TYPE_NONE;
          local_f8._8_8_ = (pFVar3->value).type.struct_def;
          local_f8._16_8_ = (pFVar3->value).type.enum_def;
          local_f8._0_4_ = BVar2;
          GenTypeBasic_abi_cxx11_(&local_118,local_140,(Type *)local_f8);
          (*(pGVar5->namer_).super_Namer._vptr_Namer[0x14])
                    (&local_138,local_190,&local_118,
                     (ulong)(pGVar5->namer_).super_Namer.config_.methods);
          std::operator+(&local_1b0,"\t\t\tbuilder.Prepend",&local_138);
          std::operator+(&local_1f0,&local_1b0,"(");
          local_b0.base_type = (pFVar3->value).type.element;
          local_b0.fixed_length = (pFVar3->value).type.fixed_length;
          local_b0.element = BASE_TYPE_NONE;
          local_b0.struct_def = (pFVar3->value).type.struct_def;
          local_b0.enum_def = (pFVar3->value).type.enum_def;
          std::operator+(&local_90,"t.",&local_1d0);
          std::operator+(&local_70,&local_90,"[j]");
          pbVar7 = &local_118;
          CastToBaseType(&local_50,local_140,&local_b0,&local_70);
          std::operator+(&local_270,&local_1f0,&local_50);
          std::operator+(&local_250,&local_270,")\n");
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&local_250);
          std::__cxx11::string::~string((string *)&local_270);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::__cxx11::string::~string((string *)&local_138);
        }
        else {
          if ((BVar2 == BASE_TYPE_STRUCT) && (((pFVar3->value).type.struct_def)->fixed == true)) {
            std::operator+(&local_270,"\t\t\tt.",&local_1d0);
            std::operator+(&local_250,&local_270,"[j].Pack(builder)\n");
            std::__cxx11::string::append((string *)code_ptr);
          }
          else {
            std::operator+(&local_270,"\t\t\tbuilder.PrependUOffsetT(",&local_210);
            std::operator+(&local_250,&local_270,"[j])\n");
            std::__cxx11::string::append((string *)code_ptr);
          }
          std::__cxx11::string::~string((string *)&local_250);
          pbVar7 = &local_270;
        }
        std::__cxx11::string::~string((string *)pbVar7);
        std::__cxx11::string::append((char *)code_ptr);
        std::operator+(&local_1b0,"\t\t",&local_160);
        std::operator+(&local_1f0,&local_1b0," = builder.EndVector(");
        std::operator+(&local_270,&local_1f0,&local_230);
        std::operator+(&local_250,&local_270,")\n");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&local_270);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::append((char *)code_ptr);
        std::__cxx11::string::~string((string *)&local_210);
        pbVar7 = &local_230;
        goto LAB_001a9846;
      }
      std::operator+(&local_210,"\t",&local_160);
      std::operator+(&local_230,&local_210," := flatbuffers.UOffsetT(0)\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_210);
      std::operator+(&local_210,"\tif t.",&local_1d0);
      std::operator+(&local_230,&local_210," != nil {\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_210);
      std::operator+(&local_270,"\t\t",&local_160);
      std::operator+(&local_250,&local_270," = builder.CreateByteString(t.");
      std::operator+(&local_210,&local_250,&local_1d0);
      std::operator+(&local_230,&local_210,")\n");
      std::__cxx11::string::append((string *)code_ptr);
LAB_001a994d:
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::append((char *)code_ptr);
      break;
    case BASE_TYPE_STRUCT:
      if (((pFVar3->value).type.struct_def)->fixed == false) {
        std::operator+(&local_270,"\t",&local_160);
        std::operator+(&local_250,&local_270," := t.");
        std::operator+(&local_210,&local_250,&local_1d0);
        std::operator+(&local_230,&local_210,".Pack(builder)\n");
        std::__cxx11::string::append((string *)code_ptr);
        goto LAB_001a91be;
      }
      break;
    case BASE_TYPE_UNION:
      std::operator+(&local_270,"\t",&local_160);
      std::operator+(&local_250,&local_270," := t.");
      std::operator+(&local_210,&local_250,&local_1d0);
      std::operator+(&local_230,&local_210,".Pack(builder)\n\n");
      std::__cxx11::string::append((string *)code_ptr);
LAB_001a91be:
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_250);
      pbVar7 = &local_270;
LAB_001a9846:
      std::__cxx11::string::~string((string *)pbVar7);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_go.cpp"
                    ,0x496,
                    "void flatbuffers::go::GoGenerator::GenNativeTablePack(const StructDef &, std::string *)"
                   );
    }
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_1d0);
    ppFVar6 = local_b8;
LAB_001a99ab:
    ppFVar6 = ppFVar6 + 1;
  } while( true );
}

Assistant:

void GenNativeTablePack(const StructDef &struct_def, std::string *code_ptr) {
    std::string &code = *code_ptr;
    const std::string struct_type = namer_.Type(struct_def);

    code += "func (t *" + NativeName(struct_def) +
            ") Pack(builder *flatbuffers.Builder) flatbuffers.UOffsetT {\n";
    code += "\tif t == nil {\n\t\treturn 0\n\t}\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const FieldDef &field = **it;
      if (field.deprecated) continue;
      if (IsScalar(field.value.type.base_type)) continue;

      const std::string field_field = namer_.Field(field);
      const std::string field_var = namer_.Variable(field);
      const std::string offset = field_var + "Offset";

      if (IsString(field.value.type)) {
        code += "\t" + offset + " := flatbuffers.UOffsetT(0)\n";
        code += "\tif t." + field_field + " != \"\" {\n";
        code += "\t\t" + offset + " = builder.CreateString(t." + field_field +
                ")\n";
        code += "\t}\n";
      } else if (IsVector(field.value.type) &&
                 field.value.type.element == BASE_TYPE_UCHAR &&
                 field.value.type.enum_def == nullptr) {
        code += "\t" + offset + " := flatbuffers.UOffsetT(0)\n";
        code += "\tif t." + field_field + " != nil {\n";
        code += "\t\t" + offset + " = builder.CreateByteString(t." +
                field_field + ")\n";
        code += "\t}\n";
      } else if (IsVector(field.value.type)) {
        code += "\t" + offset + " := flatbuffers.UOffsetT(0)\n";
        code += "\tif t." + field_field + " != nil {\n";
        std::string length = field_var + "Length";
        std::string offsets = field_var + "Offsets";
        code += "\t\t" + length + " := len(t." + field_field + ")\n";
        if (field.value.type.element == BASE_TYPE_STRING) {
          code += "\t\t" + offsets + " := make([]flatbuffers.UOffsetT, " +
                  length + ")\n";
          code += "\t\tfor j := 0; j < " + length + "; j++ {\n";
          code += "\t\t\t" + offsets + "[j] = builder.CreateString(t." +
                  field_field + "[j])\n";
          code += "\t\t}\n";
        } else if (field.value.type.element == BASE_TYPE_STRUCT &&
                   !field.value.type.struct_def->fixed) {
          code += "\t\t" + offsets + " := make([]flatbuffers.UOffsetT, " +
                  length + ")\n";
          code += "\t\tfor j := 0; j < " + length + "; j++ {\n";
          code += "\t\t\t" + offsets + "[j] = t." + field_field +
                  "[j].Pack(builder)\n";
          code += "\t\t}\n";
        }
        code += "\t\t" + struct_type + "Start" + namer_.Function(field) +
                "Vector(builder, " + length + ")\n";
        code += "\t\tfor j := " + length + " - 1; j >= 0; j-- {\n";
        if (IsScalar(field.value.type.element)) {
          code += "\t\t\tbuilder.Prepend" +
                  namer_.Method(GenTypeBasic(field.value.type.VectorType())) +
                  "(" +
                  CastToBaseType(field.value.type.VectorType(),
                                 "t." + field_field + "[j]") +
                  ")\n";
        } else if (field.value.type.element == BASE_TYPE_STRUCT &&
                   field.value.type.struct_def->fixed) {
          code += "\t\t\tt." + field_field + "[j].Pack(builder)\n";
        } else {
          code += "\t\t\tbuilder.PrependUOffsetT(" + offsets + "[j])\n";
        }
        code += "\t\t}\n";
        code += "\t\t" + offset + " = builder.EndVector(" + length + ")\n";
        code += "\t}\n";
      } else if (field.value.type.base_type == BASE_TYPE_STRUCT) {
        if (field.value.type.struct_def->fixed) continue;
        code += "\t" + offset + " := t." + field_field + ".Pack(builder)\n";
      } else if (field.value.type.base_type == BASE_TYPE_UNION) {
        code += "\t" + offset + " := t." + field_field + ".Pack(builder)\n\n";
      } else {
        FLATBUFFERS_ASSERT(0);
      }
    }
    code += "\t" + struct_type + "Start(builder)\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const FieldDef &field = **it;
      if (field.deprecated) continue;
      const std::string field_field = namer_.Field(field);
      const std::string field_fn = namer_.Function(field);
      const std::string offset = namer_.Variable(field) + "Offset";

      if (IsScalar(field.value.type.base_type)) {
        std::string prefix;
        if (field.IsScalarOptional()) {
          code += "\tif t." + field_field + " != nil {\n\t";
          prefix = "*";
        }
        if (field.value.type.enum_def == nullptr ||
            !field.value.type.enum_def->is_union) {
          code += "\t" + struct_type + "Add" + field_fn + "(builder, " +
                  prefix + "t." + field_field + ")\n";
        }
        if (field.IsScalarOptional()) { code += "\t}\n"; }
      } else {
        if (field.value.type.base_type == BASE_TYPE_STRUCT &&
            field.value.type.struct_def->fixed) {
          code += "\t" + offset + " := t." + field_field + ".Pack(builder)\n";
        } else if (field.value.type.enum_def != nullptr &&
                   field.value.type.enum_def->is_union) {
          code += "\tif t." + field_field + " != nil {\n";
          code += "\t\t" + struct_type + "Add" +
                  namer_.Method(field.name + UnionTypeFieldSuffix()) +
                  "(builder, t." + field_field + ".Type)\n";
          code += "\t}\n";
        }
        code += "\t" + struct_type + "Add" + field_fn + "(builder, " + offset +
                ")\n";
      }
    }
    code += "\treturn " + struct_type + "End(builder)\n";
    code += "}\n\n";
  }